

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_controller.cpp
# Opt level: O0

void __thiscall so_5::stats::impl::std_controller_t::body(std_controller_t *this)

{
  bool bVar1;
  duration<long,_std::ratio<1L,_1000000000L>_> local_48 [3];
  duration<long,_std::ratio<1L,_1000000000L>_> local_30;
  duration actual_duration;
  undefined1 local_20 [8];
  unique_lock<std::mutex> lock;
  std_controller_t *this_local;
  
  lock._8_8_ = this;
  do {
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)local_20,&this->m_data_lock);
    if ((this->m_shutdown_initiated & 1U) == 0) {
      local_30.__r = (rep)distribute_current_data(this);
      bVar1 = std::chrono::operator<(&local_30,&this->m_distribution_period);
      if (bVar1) {
        local_48[0].__r = (rep)std::chrono::operator-(&this->m_distribution_period,&local_30);
        std::condition_variable::wait_for<long,std::ratio<1l,1000000000l>>
                  (&this->m_wake_up_cond,(unique_lock<std::mutex> *)local_20,local_48);
      }
      actual_duration.__r._4_4_ = 0;
    }
    else {
      actual_duration.__r._4_4_ = 1;
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  } while (actual_duration.__r._4_4_ == 0);
  return;
}

Assistant:

void
std_controller_t::body()
	{
		while( true )
			{
				std::unique_lock< std::mutex > lock{ m_data_lock };

				if( m_shutdown_initiated )
					return;

				const auto actual_duration = distribute_current_data();

				if( actual_duration < m_distribution_period )
					// There is some time to sleep.
					m_wake_up_cond.wait_for(
							lock,
							m_distribution_period - actual_duration );
			}
	}